

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv__iou_fs_close(uv_loop_t *loop,uv_fs_t *req)

{
  uint uVar1;
  uv__io_uring_sqe *puVar2;
  int iVar3;
  uv__iou *iou;
  
  uVar1 = uv__kernel_version();
  iVar3 = 0;
  if (0x50f59 < uVar1) {
    iou = (uv__iou *)((long)loop->internal_fields + 0x150);
    puVar2 = uv__iou_get_sqe(iou,loop,req);
    iVar3 = 0;
    if (puVar2 != (uv__io_uring_sqe *)0x0) {
      puVar2->fd = req->file;
      puVar2->opcode = '\x13';
      uv__iou_submit(iou);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int uv__iou_fs_close(uv_loop_t* loop, uv_fs_t* req) {
  struct uv__io_uring_sqe* sqe;
  struct uv__iou* iou;

  /* Work around a poorly understood bug in older kernels where closing a file
   * descriptor pointing to /foo/bar results in ETXTBSY errors when trying to
   * execve("/foo/bar") later on. The bug seems to have been fixed somewhere
   * between 5.15.85 and 5.15.90. I couldn't pinpoint the responsible commit
   * but good candidates are the several data race fixes. Interestingly, it
   * seems to manifest only when running under Docker so the possibility of
   * a Docker bug can't be completely ruled out either. Yay, computers.
   */
  if (uv__kernel_version() < /* 5.15.90 */ 0x050F5A)
    return 0;

  iou = &uv__get_internal_fields(loop)->iou;

  sqe = uv__iou_get_sqe(iou, loop, req);
  if (sqe == NULL)
    return 0;

  sqe->fd = req->file;
  sqe->opcode = UV__IORING_OP_CLOSE;

  uv__iou_submit(iou);

  return 1;
}